

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::ParseBlendFile
          (BlenderImporter *this,FileDatabase *out,shared_ptr<Assimp::IOStream> *stream)

{
  string *__lhs;
  FileDatabase *pFVar1;
  bool bVar2;
  StreamReader<true,_true> *this_00;
  bool bVar3;
  allocator<char> local_a9;
  FileDatabase *local_a8;
  DNAParser dna_reader;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_98;
  SectionParser parser;
  
  this_00 = (StreamReader<true,_true> *)operator_new(0x38);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamReader<true,_true>::StreamReader
            (this_00,(shared_ptr<Assimp::IOStream> *)&local_98,out->little);
  std::__shared_ptr<Assimp::StreamReader<true,true>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::StreamReader<true,true>,void>
            ((__shared_ptr<Assimp::StreamReader<true,true>,(__gnu_cxx::_Lock_policy)2> *)&parser,
             this_00);
  std::__shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(out->reader).
              super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2> *)&parser);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parser.current.id);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  dna_reader.db = out;
  std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
  reserve(&(out->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
          ,0x80);
  parser.stream =
       (out->reader).
       super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  parser.ptr64 = out->i64bit;
  parser.current.id._M_dataplus._M_p = (pointer)&parser.current.id.field_2;
  parser.current.id._M_string_length = 0;
  __lhs = &parser.current.id;
  parser.current.id.field_2._M_local_buf[0] = '\0';
  parser.current.start = 0;
  parser.current.size = 0;
  parser.current.address.val = 0;
  bVar3 = true;
  local_a8 = out;
  while( true ) {
    Blender::SectionParser::Next(&parser);
    bVar2 = std::operator==(__lhs,"ENDB");
    if (bVar2) break;
    bVar2 = std::operator==(__lhs,"DNA1");
    if (bVar2) {
      bVar3 = false;
      Blender::DNAParser::Parse(&dna_reader);
    }
    else {
      std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
      push_back(&(out->entries).
                 super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                ,&parser.current);
    }
  }
  std::__cxx11::string::~string((string *)__lhs);
  pFVar1 = local_a8;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&parser,"SDNA not found",&local_a9)
    ;
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Assimp::Blender::FileBlockHead*,std::vector<Assimp::Blender::FileBlockHead,std::allocator<Assimp::Blender::FileBlockHead>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((pFVar1->entries).
             super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
             .
             super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pFVar1->entries).
             super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
             .
             super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void BlenderImporter::ParseBlendFile(FileDatabase& out, std::shared_ptr<IOStream> stream)
{
    out.reader = std::shared_ptr<StreamReaderAny>(new StreamReaderAny(stream,out.little));

    DNAParser dna_reader(out);
    const DNA* dna = NULL;

    out.entries.reserve(128); { // even small BLEND files tend to consist of many file blocks
        SectionParser parser(*out.reader.get(),out.i64bit);

        // first parse the file in search for the DNA and insert all other sections into the database
        while ((parser.Next(),1)) {
            const FileBlockHead& head = parser.GetCurrent();

            if (head.id == "ENDB") {
                break; // only valid end of the file
            }
            else if (head.id == "DNA1") {
                dna_reader.Parse();
                dna = &dna_reader.GetDNA();
                continue;
            }

            out.entries.push_back(head);
        }
    }
    if (!dna) {
        ThrowException("SDNA not found");
    }

    std::sort(out.entries.begin(),out.entries.end());
}